

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase355::run(TestCase355 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  PromiseFulfiller<int> *pPVar3;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  SourceLocation local_168;
  __pid_t local_14c;
  int local_148;
  bool local_142;
  undefined1 auStack_140 [6];
  bool _kj_shouldLog_2;
  __pid_t local_124;
  int local_120;
  DebugExpression<int> local_11c;
  undefined1 local_118 [8];
  DebugComparison<int,_int> _kjCondition_2;
  undefined4 local_f0;
  bool local_ec;
  bool _kj_shouldLog_1;
  DebugExpression<bool> local_ea;
  DebugExpression<bool> _kjCondition_1;
  undefined1 auStack_e8 [4];
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  PromiseFulfillerPair<int> pair;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase355 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x167,0xf);
  location.function = (char *)local_d8;
  location.fileName = pcStack_e0;
  location.lineNumber = in_stack_fffffffffffffe40;
  location.columnNumber = in_stack_fffffffffffffe44;
  newPromiseAndFulfiller<int>(location);
  pPVar3 = Own<kj::PromiseFulfiller<int>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<int>,_std::nullptr_t> *)&pair);
  iVar2 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
  _kj_shouldLog_1 = (bool)((byte)iVar2 & 1);
  local_ea = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kj_shouldLog_1);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_ea);
  if (!bVar1) {
    local_ec = kj::_::Debug::shouldLog(ERROR);
    while (local_ec != false) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x169,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\", _kjCondition",
                 (char (*) [45])"failed: expected pair.fulfiller->isWaiting()",&local_ea);
      local_ec = false;
    }
  }
  pPVar3 = Own<kj::PromiseFulfiller<int>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<int>,_std::nullptr_t> *)&pair);
  local_f0 = 0x7b;
  (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_f0);
  pPVar3 = Own<kj::PromiseFulfiller<int>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<int>,_std::nullptr_t> *)&pair);
  iVar2 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
  _kjCondition_2._30_1_ = ~(byte)iVar2 & 1;
  _kjCondition_2._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x1e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_2.field_0x1f);
  if (!bVar1) {
    _kjCondition_2._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._29_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x16b,ERROR,
                 "\"failed: expected \" \"!(pair.fulfiller->isWaiting())\", _kjCondition",
                 (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())",
                 (DebugExpression<bool> *)&_kjCondition_2.field_0x1f);
      _kjCondition_2._29_1_ = 0;
    }
  }
  local_120 = 0x7b;
  local_11c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_120);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_140,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x16d,0x2e);
  local_124 = Promise<int>::wait((Promise<int> *)local_d0,local_a8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_118,&local_11c,&local_124);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
  if (!bVar1) {
    local_142 = kj::_::Debug::shouldLog(ERROR);
    while (local_142 != false) {
      local_148 = 0x7b;
      SourceLocation::SourceLocation
                (&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x16d,0x2e);
      local_14c = Promise<int>::wait((Promise<int> *)local_d0,local_a8);
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"(123) == (pair.promise.wait(waitScope))\", _kjCondition, 123, pair.promise.wait(waitScope)"
                 ,(char (*) [57])"failed: expected (123) == (pair.promise.wait(waitScope))",
                 (DebugComparison<int,_int> *)local_118,&local_148,&local_14c);
      local_142 = false;
    }
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair((PromiseFulfillerPair<int> *)local_d0);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, SeparateFulfiller) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(123);
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}